

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ss_swapmerge(uchar *T,int *PA,int *first,int *middle,int *last,int *buf,int bufsize,int depth)

{
  uint *puVar1;
  int iVar2;
  uint *a;
  uint *puVar3;
  uint *in_RCX;
  uint *puVar4;
  uint *in_RDX;
  int *in_RSI;
  int *in_RDI;
  uint *in_R8;
  int in_stack_00000008;
  int in_stack_00000010;
  int next;
  int check;
  int ssize;
  int half;
  int len;
  int m;
  int *rm;
  int *lm;
  int *r;
  int *l;
  anon_struct_32_4_d8a569f3 stack [32];
  uint local_54c;
  undefined4 in_stack_fffffffffffffac8;
  uint in_stack_fffffffffffffacc;
  int *in_stack_fffffffffffffad0;
  int *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  uint in_stack_fffffffffffffae4;
  int *in_stack_fffffffffffffae8;
  int *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffafc;
  int *in_stack_fffffffffffffb00;
  int *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  uint in_stack_fffffffffffffb14;
  int *in_stack_fffffffffffffb20;
  long local_4d8;
  uint local_4cc;
  uint local_4b4;
  uint local_49c;
  uint local_484;
  uint local_470;
  uint local_46c;
  int local_468;
  uint local_464;
  uint local_460;
  int local_45c;
  uint *local_448;
  uint *local_440;
  undefined8 local_438 [3];
  uint auStack_420 [254];
  uint *local_28;
  uint *local_20;
  uint *local_18;
  int *local_10;
  int *local_8;
  
  local_46c = 0;
  local_468 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    while ((long)in_stack_00000008 < (long)local_28 - (long)local_20 >> 2) {
      if ((long)in_stack_00000008 < (long)local_20 - (long)local_18 >> 2) {
        local_45c = 0;
        if ((long)local_20 - (long)local_18 >> 2 < (long)local_28 - (long)local_20 >> 2) {
          local_4d8 = (long)local_20 - (long)local_18;
        }
        else {
          local_4d8 = (long)local_28 - (long)local_20;
        }
        local_4d8 = local_4d8 >> 2;
        local_460 = (uint)local_4d8;
        while (local_464 = (int)local_460 >> 1, 0 < (int)local_460) {
          if ((int)local_20[(long)local_45c + (long)(int)local_464] < 0) {
            in_stack_fffffffffffffb14 =
                 local_20[(long)local_45c + (long)(int)local_464] ^ 0xffffffff;
          }
          else {
            in_stack_fffffffffffffb14 = local_20[(long)local_45c + (long)(int)local_464];
          }
          in_stack_fffffffffffffb00 = local_10 + (int)in_stack_fffffffffffffb14;
          if ((int)local_20[(-1 - (long)(int)local_464) - (long)local_45c] < 0) {
            in_stack_fffffffffffffafc =
                 local_20[(-1 - (long)(int)local_464) - (long)local_45c] ^ 0xffffffff;
          }
          else {
            in_stack_fffffffffffffafc = local_20[(-1 - (long)(int)local_464) - (long)local_45c];
          }
          in_stack_fffffffffffffb08 = local_10;
          in_stack_fffffffffffffb20 = local_10;
          iVar2 = ss_compare((uchar *)local_8,in_stack_fffffffffffffb00,
                             local_10 + (int)in_stack_fffffffffffffafc,in_stack_00000010);
          if (iVar2 < 0) {
            local_45c = local_464 + 1 + local_45c;
            local_464 = local_464 - (local_460 & 1 ^ 1);
          }
          local_460 = local_464;
        }
        if (local_45c < 1) {
          if ((int)local_20[-1] < 0) {
            in_stack_fffffffffffffae4 = local_20[-1] ^ 0xffffffff;
          }
          else {
            in_stack_fffffffffffffae4 = local_20[-1];
          }
          in_stack_fffffffffffffae8 = local_8;
          in_stack_fffffffffffffaf0 = local_10;
          iVar2 = ss_compare((uchar *)local_8,local_10 + (int)in_stack_fffffffffffffae4,
                             local_10 + (int)*local_20,in_stack_00000010);
          if (iVar2 == 0) {
            *local_20 = *local_20 ^ 0xffffffff;
          }
          if ((local_46c & 1) == 0) {
            if ((local_46c & 2) != 0) {
              if ((int)local_18[-1] < 0) {
                in_stack_fffffffffffffacc = local_18[-1] ^ 0xffffffff;
              }
              else {
                in_stack_fffffffffffffacc = local_18[-1];
              }
              in_stack_fffffffffffffad0 = local_8;
              in_stack_fffffffffffffad8 = local_10;
              iVar2 = ss_compare((uchar *)local_8,local_10 + (int)in_stack_fffffffffffffacc,
                                 local_10 + (int)*local_18,in_stack_00000010);
              if (iVar2 == 0) goto LAB_0044513e;
            }
          }
          else {
LAB_0044513e:
            *local_18 = *local_18 ^ 0xffffffff;
          }
          if ((local_46c & 4) != 0) {
            if ((int)local_28[-1] < 0) {
              local_54c = local_28[-1] ^ 0xffffffff;
            }
            else {
              local_54c = local_28[-1];
            }
            iVar2 = ss_compare((uchar *)local_8,local_10 + (int)local_54c,local_10 + (int)*local_28,
                               in_stack_00000010);
            if (iVar2 == 0) {
              *local_28 = *local_28 ^ 0xffffffff;
            }
          }
          if (local_468 < 0) {
            __assert_fail("0 <= ssize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb7f2,
                          "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                         );
          }
          if (local_468 == 0) {
            return;
          }
          local_468 = local_468 + -1;
          local_18 = (uint *)local_438[(long)local_468 * 4];
          local_20 = (uint *)local_438[(long)local_468 * 4 + 1];
          local_28 = *(uint **)(auStack_420 + (long)local_468 * 8 + -2);
          local_46c = auStack_420[(long)local_468 * 8];
        }
        else {
          a = local_20 + -(long)local_45c;
          puVar3 = local_20 + local_45c;
          ss_blockswap((int *)a,(int *)local_20,local_45c);
          local_448 = local_20;
          local_440 = local_20;
          local_470 = 0;
          if (puVar3 < local_28) {
            if ((int)*puVar3 < 0) {
              *puVar3 = *puVar3 ^ 0xffffffff;
              if (local_18 < a) {
                do {
                  puVar4 = local_440 + -1;
                  puVar1 = local_440 + -1;
                  local_440 = puVar4;
                } while ((int)*puVar1 < 0);
                local_470 = 4;
              }
              local_470 = local_470 | 1;
            }
            else if (local_18 < a) {
              for (; (int)*local_448 < 0; local_448 = local_448 + 1) {
              }
              local_470 = 2;
            }
          }
          if ((long)local_28 - (long)local_448 >> 2 < (long)local_440 - (long)local_18 >> 2) {
            if (((local_470 & 2) != 0) && (local_448 == local_20)) {
              local_470 = local_470 ^ 6;
            }
            if (0x1f < local_468) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb7ea,
                            "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                           );
            }
            local_438[(long)local_468 * 4] = local_18;
            local_438[(long)local_468 * 4 + 1] = a;
            *(uint **)(auStack_420 + (long)local_468 * 8 + -2) = local_440;
            auStack_420[(long)local_468 * 8] = local_46c & 3 | local_470 & 4;
            local_18 = local_448;
            local_20 = puVar3;
            local_46c = local_470 & 3 | local_46c & 4;
          }
          else {
            if (0x1f < local_468) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb7e6,
                            "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                           );
            }
            local_438[(long)local_468 * 4] = local_448;
            local_438[(long)local_468 * 4 + 1] = puVar3;
            *(uint **)(auStack_420 + (long)local_468 * 8 + -2) = local_28;
            auStack_420[(long)local_468 * 8] = local_470 & 3 | local_46c & 4;
            local_20 = a;
            local_28 = local_440;
            local_46c = local_46c & 3 | local_470 & 4;
          }
          local_468 = local_468 + 1;
        }
      }
      else {
        if (local_18 < local_20) {
          ss_mergeforward((uchar *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                          (int *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                          in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                          (int *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                          (int)in_stack_fffffffffffffb00);
        }
        if ((local_46c & 1) == 0) {
          if ((local_46c & 2) != 0) {
            if ((int)local_18[-1] < 0) {
              local_4b4 = local_18[-1] ^ 0xffffffff;
            }
            else {
              local_4b4 = local_18[-1];
            }
            iVar2 = ss_compare((uchar *)local_8,local_10 + (int)local_4b4,local_10 + (int)*local_18,
                               in_stack_00000010);
            if (iVar2 == 0) goto LAB_004447a2;
          }
        }
        else {
LAB_004447a2:
          *local_18 = *local_18 ^ 0xffffffff;
        }
        if ((local_46c & 4) != 0) {
          if ((int)local_28[-1] < 0) {
            local_4cc = local_28[-1] ^ 0xffffffff;
          }
          else {
            local_4cc = local_28[-1];
          }
          iVar2 = ss_compare((uchar *)local_8,local_10 + (int)local_4cc,local_10 + (int)*local_28,
                             in_stack_00000010);
          if (iVar2 == 0) {
            *local_28 = *local_28 ^ 0xffffffff;
          }
        }
        if (local_468 < 0) {
          __assert_fail("0 <= ssize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb7c8,
                        "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                       );
        }
        if (local_468 == 0) {
          return;
        }
        local_468 = local_468 + -1;
        local_18 = (uint *)local_438[(long)local_468 * 4];
        local_20 = (uint *)local_438[(long)local_468 * 4 + 1];
        local_28 = *(uint **)(auStack_420 + (long)local_468 * 8 + -2);
        local_46c = auStack_420[(long)local_468 * 8];
      }
    }
    if ((local_18 < local_20) && (local_20 < local_28)) {
      ss_mergebackward((uchar *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                       (int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                       in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                       (int)in_stack_fffffffffffffb20);
    }
    if ((local_46c & 1) == 0) {
      if ((local_46c & 2) != 0) {
        if ((int)local_18[-1] < 0) {
          local_484 = local_18[-1] ^ 0xffffffff;
        }
        else {
          local_484 = local_18[-1];
        }
        iVar2 = ss_compare((uchar *)local_8,local_10 + (int)local_484,local_10 + (int)*local_18,
                           in_stack_00000010);
        if (iVar2 == 0) goto LAB_004444a1;
      }
    }
    else {
LAB_004444a1:
      *local_18 = *local_18 ^ 0xffffffff;
    }
    if ((local_46c & 4) != 0) {
      if ((int)local_28[-1] < 0) {
        local_49c = local_28[-1] ^ 0xffffffff;
      }
      else {
        local_49c = local_28[-1];
      }
      iVar2 = ss_compare((uchar *)local_8,local_10 + (int)local_49c,local_10 + (int)*local_28,
                         in_stack_00000010);
      if (iVar2 == 0) {
        *local_28 = *local_28 ^ 0xffffffff;
      }
    }
    if (local_468 < 0) {
      __assert_fail("0 <= ssize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb7bf,
                    "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                   );
    }
    if (local_468 == 0) {
      return;
    }
    local_468 = local_468 + -1;
    local_18 = (uint *)local_438[(long)local_468 * 4];
    local_20 = (uint *)local_438[(long)local_468 * 4 + 1];
    local_28 = *(uint **)(auStack_420 + (long)local_468 * 8 + -2);
    local_46c = auStack_420[(long)local_468 * 8];
  } while( true );
}

Assistant:

static
void
ss_swapmerge(const unsigned char *T, const int *PA,
             int *first, int *middle, int *last,
             int *buf, int bufsize, int depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { int *a, *b, *c; int d; } stack[STACK_SIZE];
  int *l, *r, *lm, *rm;
  int m, len, half;
  int ssize;
  int check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}